

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O2

int4 power2Divide(int4 n,uint8 divisor,uint8 *q,uint8 *r)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int4 iVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  ulong y;
  ulong uVar8;
  ulong uVar9;
  uint8 mult [2];
  uint8 local_48;
  ulong uStack_40;
  
  if (divisor == 0) {
    return 2;
  }
  bVar7 = (byte)n;
  if (n < 0x40) {
    uVar5 = 1L << (bVar7 & 0x3f);
    iVar4 = 0;
    *q = uVar5 / divisor;
    *r = uVar5 % divisor;
  }
  else {
    uVar5 = divisor >> (bVar7 & 0x3f);
    iVar4 = 1;
    if (uVar5 != 0) {
      if (uVar5 == 1) {
        uVar9 = 1L << (bVar7 - 0x40 & 0x3f);
        if (uVar9 == divisor) {
          return 1;
        }
        uVar6 = 0xffffffffffffffff;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5 >> 1;
        uVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar1,0) + 1;
        uVar9 = 1L << (bVar7 - 0x40 & 0x3f);
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (uVar5 >> 1) + 1;
      local_48 = 0;
      uStack_40 = 0;
      uVar5 = 0;
      y = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar2,0) - 1;
      while (uVar8 = uVar6, y + 1 < uVar8) {
        uVar6 = y + uVar8 >> 1;
        uVar5 = uVar6 | 0x8000000000000000;
        if (!CARRY8(y,uVar8)) {
          uVar5 = uVar6;
        }
        mult64to128(&local_48,divisor,uVar5);
        bVar3 = local_48 != 0;
        if (uVar9 != uStack_40) {
          bVar3 = uVar9 < uStack_40;
        }
        uVar6 = uVar5 - 1;
        if (!bVar3) {
          y = uVar5;
          uVar6 = uVar8;
        }
      }
      if (uVar5 != y) {
        mult64to128(&local_48,divisor,y);
      }
      iVar4 = 0;
      uVar5 = y + 1;
      if (-local_48 < divisor && (-uStack_40 - (ulong)(local_48 != 0)) + uVar9 == 0) {
        divisor = 0;
        uVar5 = y;
      }
      *q = uVar5;
      *r = -local_48 - divisor;
    }
  }
  return iVar4;
}

Assistant:

int4 power2Divide(int4 n,uint8 divisor,uint8 &q,uint8 &r)

{
  if (divisor == 0) return 2;
  uint8 power = 1;
  if (n < 64) {
    power <<= n;
    q = power / divisor;
    r = power % divisor;
    return 0;
  }
  // Divide numerand and divisor by 2^(n-63) to get approximation of result
  uint8 y = divisor >> (n-64);	// Most of the way on divisor
  if (y == 0) return 1;		// Check if result will be too big
  y >>= 1;			// Divide divisor by final bit
  power <<= 63;
  uint8 max;
  if (y == 0) {
    max = 0;
    max -= 1;			// Could be maximal
    // Check if divisor is a power of 2
    if ((((uint8)1) << (n-64)) == divisor)
      return 1;
  }
  else
    max = power / y + 1;
  uint8 min = power / (y+1);
  if (min != 0)
    min -= 1;
  uint8 fullpower[2];
  fullpower[1] = ((uint8)1)<<(n-64);
  fullpower[0] = 0;
  uint8 mult[2];
  mult[0] = 0;
  mult[1] = 0;
  uint8 tmpq = 0;
  while(max > min+1) {
    tmpq = max + min;
    if (tmpq < min) {
      tmpq = (tmpq>>1) + 0x8000000000000000L;
    }
    else
      tmpq >>= 1;
    mult64to128(mult,divisor,tmpq);
    if (unsignedCompare128(fullpower,mult) < 0)
      max = tmpq-1;
    else
      min = tmpq;
  }
  // min is now our putative quotient
  if (tmpq != min)
    mult64to128(mult,divisor,min);
  unsignedSubtract128(fullpower,mult); // Calculate remainder
  // min might be 1 too small
  if (fullpower[1] != 0 || fullpower[0] >= divisor) {
    q = min + 1;
    r = fullpower[0] - divisor;
  }
  else {
    q = min;
    r = fullpower[0];
  }
  return 0;
}